

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O0

void __thiscall Pda::readJson(Pda *this,string *file)

{
  undefined8 to_00;
  Node *from_00;
  bool bVar1;
  __type _Var2;
  ostream *this_00;
  reference pvVar3;
  char *pcVar4;
  undefined1 *puVar5;
  string local_448;
  char *local_428;
  char *input_c;
  undefined1 local_418 [7];
  char c_3;
  string input_s;
  Node *to;
  Node *local_3d0;
  Node *from;
  string n;
  string top;
  undefined1 local_380 [7];
  char stacktop;
  string r;
  string local_358 [4];
  int j;
  string rep;
  undefined1 local_318 [8];
  string c_2;
  undefined1 local_2f0 [6];
  bool startState;
  bool endstate;
  string startname;
  string c_1;
  string c;
  string sa;
  string local_268 [4];
  int i;
  string s;
  istream local_238 [8];
  fstream f;
  undefined1 local_28 [8];
  json parser;
  string *file_local;
  Pda *this_local;
  
  parser.m_value = (json_value)file;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_28,(nullptr_t)0x0);
  std::fstream::fstream(local_238);
  std::__cxx11::string::string(local_268);
  std::operator>>(local_238,local_268);
  this_00 = std::operator<<((ostream *)&std::cout,local_268);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::operator|(_S_in,_S_out);
  std::fstream::open((string *)local_238,(_Ios_Openmode)file);
  nlohmann::operator>>
            (local_238,
             (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)local_28);
  sa.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)(c.field_2._M_local_buf + 8));
  while( true ) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_28,"StackAlphabet");
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](pvVar3,(long)(int)sa.field_2._12_4_);
    bVar1 = nlohmann::operator!=<std::nullptr_t,_0>(pvVar3,(void *)0x0);
    if (!bVar1) break;
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_28,"StackAlphabet");
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](pvVar3,(long)(int)sa.field_2._12_4_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&c_1.field_2 + 8),pvVar3);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&c_1.field_2 + 8),"Z0");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)(c_1.field_2._M_local_buf + 8),"z");
    }
    std::__cxx11::string::operator+=
              ((string *)(c.field_2._M_local_buf + 8),(string *)(c_1.field_2._M_local_buf + 8));
    sa.field_2._12_4_ = sa.field_2._12_4_ + 1;
    std::__cxx11::string::~string((string *)(c_1.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::operator=
            ((string *)&this->stack_alphabet,(string *)(c.field_2._M_local_buf + 8));
  sa.field_2._12_4_ = 0;
  std::__cxx11::string::operator=((string *)(c.field_2._M_local_buf + 8),"");
  while( true ) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_28,"Alphabet");
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](pvVar3,(long)(int)sa.field_2._12_4_);
    bVar1 = nlohmann::operator!=<std::nullptr_t,_0>(pvVar3,(void *)0x0);
    if (!bVar1) break;
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_28,"Alphabet");
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](pvVar3,(long)(int)sa.field_2._12_4_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&startname.field_2 + 8),pvVar3);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&startname.field_2 + 8),"Z0");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)(startname.field_2._M_local_buf + 8),"z");
    }
    std::__cxx11::string::operator+=
              ((string *)(c.field_2._M_local_buf + 8),(string *)(startname.field_2._M_local_buf + 8)
              );
    sa.field_2._12_4_ = sa.field_2._12_4_ + 1;
    std::__cxx11::string::~string((string *)(startname.field_2._M_local_buf + 8));
  }
  std::__cxx11::string::operator=((string *)this,(string *)(c.field_2._M_local_buf + 8));
  sa.field_2._12_4_ = 0;
  pvVar3 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)local_28,"StartState");
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f0,pvVar3);
  while( true ) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_28,"States");
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](pvVar3,(long)(int)sa.field_2._12_4_);
    bVar1 = nlohmann::operator!=<std::nullptr_t,_0>(pvVar3,(void *)0x0);
    if (!bVar1) break;
    c_2.field_2._M_local_buf[0xf] = '\0';
    c_2.field_2._M_local_buf[0xe] = '\0';
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_28,"States");
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](pvVar3,(long)(int)sa.field_2._12_4_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,pvVar3
              );
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_28,"States");
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](pvVar3,(long)(int)sa.field_2._12_4_);
    bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar3,"qf");
    if (bVar1) {
      c_2.field_2._M_local_buf[0xf] = '\x01';
    }
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_2f0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_318);
    if (_Var2) {
      c_2.field_2._M_local_buf[0xe] = '\x01';
    }
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_28,"States");
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](pvVar3,(long)(int)sa.field_2._12_4_);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&rep.field_2 + 8),pvVar3);
    addNode(this,(string *)((long)&rep.field_2 + 8),(bool)(c_2.field_2._M_local_buf[0xe] & 1),
            (bool)(c_2.field_2._M_local_buf[0xf] & 1));
    std::__cxx11::string::~string((string *)(rep.field_2._M_local_buf + 8));
    sa.field_2._12_4_ = sa.field_2._12_4_ + 1;
    std::__cxx11::string::~string((string *)local_318);
  }
  sa.field_2._12_4_ = 0;
  while( true ) {
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_28,"Transitions");
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](pvVar3,(long)(int)sa.field_2._12_4_);
    bVar1 = nlohmann::operator!=<std::nullptr_t,_0>(pvVar3,(void *)0x0);
    if (!bVar1) break;
    std::__cxx11::string::string(local_358);
    r.field_2._12_4_ = 0;
    while( true ) {
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_28,"Transitions");
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](pvVar3,(long)(int)sa.field_2._12_4_);
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pvVar3,"replacement");
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](pvVar3,(long)(int)r.field_2._12_4_);
      bVar1 = nlohmann::operator!=<std::nullptr_t,_0>(pvVar3,(void *)0x0);
      if (!bVar1) break;
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)local_28,"Transitions");
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](pvVar3,(long)(int)sa.field_2._12_4_);
      pvVar3 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pvVar3,"replacement");
      pvVar3 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](pvVar3,(long)(int)r.field_2._12_4_);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380,
                 pvVar3);
      std::__cxx11::string::operator+=(local_358,(string *)local_380);
      r.field_2._12_4_ = r.field_2._12_4_ + 1;
      std::__cxx11::string::~string((string *)local_380);
    }
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_28,"Transitions");
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](pvVar3,(long)(int)sa.field_2._12_4_);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar3,"stacktop");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&n.field_2 + 8),pvVar3);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&n.field_2 + 8),"Z0");
    if (bVar1) {
      top.field_2._M_local_buf[0xf] = 'z';
    }
    else {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)((long)&n.field_2 + 8));
      top.field_2._M_local_buf[0xf] = *pcVar4;
    }
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_28,"Transitions");
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](pvVar3,(long)(int)sa.field_2._12_4_);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar3,"from");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&from,pvVar3);
    local_3d0 = searchNode(this,(string *)&from);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_28,"Transitions");
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](pvVar3,(long)(int)sa.field_2._12_4_);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar3,"to");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&to,pvVar3);
    std::__cxx11::string::operator=((string *)&from,(string *)&to);
    std::__cxx11::string::~string((string *)&to);
    input_s.field_2._8_8_ = searchNode(this,(string *)&from);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)local_28,"Transitions");
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](pvVar3,(long)(int)sa.field_2._12_4_);
    pvVar3 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar3,"input");
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418,pvVar3
              );
    puVar5 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_418);
    from_00 = local_3d0;
    to_00 = input_s.field_2._8_8_;
    input_c._7_1_ = *puVar5;
    local_428 = (char *)((long)&input_c + 7);
    std::__cxx11::string::string((string *)&local_448,local_358);
    addFunct(this,from_00,(Node *)to_00,top.field_2._M_local_buf[0xf],&local_448,*local_428);
    std::__cxx11::string::~string((string *)&local_448);
    sa.field_2._12_4_ = sa.field_2._12_4_ + 1;
    std::__cxx11::string::~string((string *)local_418);
    std::__cxx11::string::~string((string *)&from);
    std::__cxx11::string::~string((string *)(n.field_2._M_local_buf + 8));
    std::__cxx11::string::~string(local_358);
  }
  std::__cxx11::string::~string((string *)local_2f0);
  std::__cxx11::string::~string((string *)(c.field_2._M_local_buf + 8));
  std::__cxx11::string::~string(local_268);
  std::fstream::~fstream(local_238);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_28);
  return;
}

Assistant:

void Pda::readJson(const std::string file) {
    nlohmann::json parser;
    std::fstream f;
    std::string s;
    f >> s;
    std::cout<<s<<std::endl;
    f.open(file);
    f >> parser;

    int i = 0;

    std::string sa;
    while(parser["StackAlphabet"][i] != nullptr){
        std::string c = parser["StackAlphabet"][i];
        if(c == "Z0"){
            c="z";
        }

        sa += c;
        i+=1;
    }
    this->stack_alphabet = sa;
    i = 0;
    sa = "";
    while(parser["Alphabet"][i] != nullptr){
        std::string c = parser["Alphabet"][i];
        if(c == "Z0"){
            c="z";
        }

        sa += c;
        i+=1;
    }

    this->alphabet = sa;


    i = 0;
    //nodes toevoegen

    std::string startname= parser["StartState"];

    while(parser["States"][i] != nullptr){
        bool endstate = false;
        bool startState = false;
        std::string c = parser["States"][i];

        if(parser["States"][i] == "qf"){
            endstate = true;
        }
        if(startname == c){
            startState = true;
        }
        addNode(parser["States"][i],startState, endstate);

        i+=1;


    }

    i = 0;
    while(parser["Transitions"][i] != nullptr){

        std::string rep;
        int j =0;
        while(parser["Transitions"][i]["replacement"][j] != nullptr){
            std::string r = parser["Transitions"][i]["replacement"][j];
            rep += r;
            j+=1;

        }
        char stacktop;
        std::string top = parser["Transitions"][i]["stacktop"];
        if(top == "Z0"){
            stacktop = 'z';
        }else{
            stacktop = top[0];
        }

        std::string n = parser["Transitions"][i]["from"];
        Tjen::Node* from = searchNode(n);
        n = parser["Transitions"][i]["to"];
        Tjen::Node* to = searchNode(n);
        std::string input_s = parser["Transitions"][i]["input"];
        char c = input_s[0];
        const char* input_c = &c;

        addFunct(from,to,stacktop,rep,*input_c);
        i+=1;
    }
}